

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::CheckBlockDecoration
          (ValidationState_t *vstate,Instruction *inst,Decoration *decoration)

{
  uint32_t uVar1;
  Op OVar2;
  Decoration DVar3;
  DiagnosticStream *pDVar4;
  DiagnosticStream local_208;
  char *local_30;
  char *dec_name;
  Decoration *decoration_local;
  Instruction *inst_local;
  ValidationState_t *vstate_local;
  
  dec_name = (char *)decoration;
  decoration_local = (Decoration *)inst;
  inst_local = (Instruction *)vstate;
  uVar1 = Instruction::id(inst);
  if (uVar1 == 0) {
    __assert_fail("inst.id() && \"Parser ensures the target of the decoration has an ID\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                  ,0x797,
                  "spv_result_t spvtools::val::(anonymous namespace)::CheckBlockDecoration(ValidationState_t &, const Instruction &, const Decoration &)"
                 );
  }
  OVar2 = Instruction::opcode((Instruction *)decoration_local);
  if (OVar2 == OpTypeStruct) {
    vstate_local._4_4_ = SPV_SUCCESS;
  }
  else {
    DVar3 = Decoration::dec_type((Decoration *)dec_name);
    local_30 = "BufferBlock";
    if (DVar3 == Block) {
      local_30 = "Block";
    }
    ValidationState_t::diag
              (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
               (Instruction *)decoration_local);
    pDVar4 = DiagnosticStream::operator<<(&local_208,&local_30);
    pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [34])" decoration on a non-struct type.")
    ;
    vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  return vstate_local._4_4_;
}

Assistant:

spv_result_t CheckBlockDecoration(ValidationState_t& vstate,
                                  const Instruction& inst,
                                  const Decoration& decoration) {
  assert(inst.id() && "Parser ensures the target of the decoration has an ID");
  if (inst.opcode() != spv::Op::OpTypeStruct) {
    const char* const dec_name = decoration.dec_type() == spv::Decoration::Block
                                     ? "Block"
                                     : "BufferBlock";
    return vstate.diag(SPV_ERROR_INVALID_ID, &inst)
           << dec_name << " decoration on a non-struct type.";
  }
  return SPV_SUCCESS;
}